

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_flip(void **param_1)

{
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *max;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *r3_1;
  roaring64_bitmap_t *r2_3;
  roaring64_bitmap_t *r1_3;
  roaring64_bitmap_t *r2_2;
  roaring64_bitmap_t *r1_2;
  roaring64_bitmap_t *r3;
  roaring64_bitmap_t *r2_1;
  roaring64_bitmap_t *r1_1;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000078;
  roaring64_bitmap_t *in_stack_000000e0;
  roaring64_bitmap_t *in_stack_000000e8;
  uint64_t in_stack_ffffffffffffff88;
  int line;
  roaring64_bitmap_t *in_stack_ffffffffffffff90;
  roaring64_bitmap_t *in_stack_ffffffffffffff98;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffa0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffd8;
  
  roaring64_bitmap_create();
  prVar1 = roaring64_bitmap_flip
                     (in_stack_ffffffffffffff98,(uint64_t)in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
  assert_r64_valid(in_stack_ffffffffffffff90);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r1);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,(int)(in_stack_ffffffffffffff88 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  max = test_flip::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffa0);
  roaring64_bitmap_flip
            (in_stack_ffffffffffffff98,(uint64_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
            );
  assert_r64_valid(in_stack_ffffffffffffff90);
  test_flip::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffb0);
  roaring64_bitmap_equals(in_stack_000000e8,in_stack_000000e0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,(int)(in_stack_ffffffffffffff88 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  test_flip::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffa0);
  roaring64_bitmap_flip
            (in_stack_ffffffffffffff98,(uint64_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
            );
  assert_r64_valid(in_stack_ffffffffffffff90);
  roaring64_bitmap_equals(in_stack_000000e8,in_stack_000000e0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,(int)(in_stack_ffffffffffffff88 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  r = (roaring64_bitmap_t *)
      test_flip::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffa0);
  b = roaring64_bitmap_flip
                (in_stack_ffffffffffffff98,(uint64_t)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
  prVar1 = roaring64_bitmap_from_range((uint64_t)prVar1,(uint64_t)max,in_stack_ffffffffffffffd8);
  line = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_remove(r,(uint64_t)in_stack_ffffffffffffff98);
  assert_r64_valid((roaring64_bitmap_t *)b);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_equals(in_stack_000000e8,in_stack_000000e0);
  _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff98,(char *)b,line);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r2_2);
  return;
}

Assistant:

DEFINE_TEST(test_flip) {
    {
        // Flipping an empty bitmap should result in a non-empty range.
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 10, 100000);
        assert_r64_valid(r2);
        assert_true(roaring64_bitmap_contains_range(r2, 10, 100000));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // Only the specified range should be flipped.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 2, 5);
        assert_r64_valid(r2);
        roaring64_bitmap_t* r3 = roaring64_bitmap_from(1, 2, 4, 6);
        assert_true(roaring64_bitmap_equals(r2, r3));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
        roaring64_bitmap_free(r3);
    }
    {
        // An empty range does nothing.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 3, 3);
        assert_r64_valid(r2);
        assert_true(roaring64_bitmap_equals(r2, r1));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // A bitmap with values in all affected containers.
        roaring64_bitmap_t* r1 =
            roaring64_bitmap_from((2 << 16), (3 << 16) + 1, (4 << 16) + 3);
        roaring64_bitmap_t* r2 =
            roaring64_bitmap_flip(r1, (2 << 16), (4 << 16) + 4);
        roaring64_bitmap_t* r3 =
            roaring64_bitmap_from_range((2 << 16) + 1, (4 << 16) + 3, 1);
        roaring64_bitmap_remove(r3, (3 << 16) + 1);
        assert_r64_valid(r2);
        assert_r64_valid(r3);
        assert_true(roaring64_bitmap_equals(r2, r3));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
        roaring64_bitmap_free(r3);
    }
}